

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O3

bool __thiscall
Lib::DArray<std::pair<Kernel::TermOrderingDiagram::Branch,_Kernel::TermOrderingDiagram::Branch>_>::
ensure(DArray<std::pair<Kernel::TermOrderingDiagram::Branch,_Kernel::TermOrderingDiagram::Branch>_>
       *this,size_t s)

{
  ulong uVar1;
  pair<Kernel::TermOrderingDiagram::Branch,_Kernel::TermOrderingDiagram::Branch> *ppVar2;
  pair<Kernel::TermOrderingDiagram::Branch,_Kernel::TermOrderingDiagram::Branch> *__s;
  ulong uVar3;
  ulong uVar4;
  pair<Kernel::TermOrderingDiagram::Branch,_Kernel::TermOrderingDiagram::Branch> *res;
  
  uVar1 = this->_capacity;
  if (uVar1 < s) {
    uVar3 = uVar1 * 2;
    if (uVar3 < s || uVar3 - s == 0) {
      uVar3 = s;
    }
    uVar4 = uVar3 << 4;
    if (uVar4 == 0) {
      __s = (pair<Kernel::TermOrderingDiagram::Branch,_Kernel::TermOrderingDiagram::Branch> *)
            FixedSizeAllocator<8UL>::alloc((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR)
      ;
    }
    else if (uVar4 < 0x11) {
      __s = (pair<Kernel::TermOrderingDiagram::Branch,_Kernel::TermOrderingDiagram::Branch> *)
            FixedSizeAllocator<16UL>::alloc
                      ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar4 < 0x19) {
      __s = (pair<Kernel::TermOrderingDiagram::Branch,_Kernel::TermOrderingDiagram::Branch> *)
            FixedSizeAllocator<24UL>::alloc
                      ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar4 < 0x21) {
      __s = (pair<Kernel::TermOrderingDiagram::Branch,_Kernel::TermOrderingDiagram::Branch> *)
            FixedSizeAllocator<32UL>::alloc
                      ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar4 < 0x31) {
      __s = (pair<Kernel::TermOrderingDiagram::Branch,_Kernel::TermOrderingDiagram::Branch> *)
            FixedSizeAllocator<48UL>::alloc
                      ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar4 < 0x41) {
      __s = (pair<Kernel::TermOrderingDiagram::Branch,_Kernel::TermOrderingDiagram::Branch> *)
            FixedSizeAllocator<64UL>::alloc
                      ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      __s = (pair<Kernel::TermOrderingDiagram::Branch,_Kernel::TermOrderingDiagram::Branch> *)
            ::operator_new(uVar4,0x10);
    }
    memset(__s,0,uVar4);
    if (this->_array !=
        (pair<Kernel::TermOrderingDiagram::Branch,_Kernel::TermOrderingDiagram::Branch> *)0x0) {
      array_delete<std::pair<Kernel::TermOrderingDiagram::Branch,Kernel::TermOrderingDiagram::Branch>>
                (this->_array,this->_capacity);
      ppVar2 = this->_array;
      if (ppVar2 != (pair<Kernel::TermOrderingDiagram::Branch,_Kernel::TermOrderingDiagram::Branch>
                     *)0x0) {
        uVar4 = this->_capacity << 4;
        if (uVar4 == 0) {
          (ppVar2->first)._node = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppVar2;
        }
        else if (uVar4 < 0x11) {
          (ppVar2->first)._node = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppVar2;
        }
        else if (uVar4 < 0x19) {
          (ppVar2->first)._node = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppVar2;
        }
        else if (uVar4 < 0x21) {
          (ppVar2->first)._node = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppVar2;
        }
        else if (uVar4 < 0x31) {
          (ppVar2->first)._node = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppVar2;
        }
        else if (uVar4 < 0x41) {
          (ppVar2->first)._node = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppVar2;
        }
        else {
          operator_delete(ppVar2,0x10);
        }
      }
    }
    this->_size = s;
    this->_capacity = uVar3;
    this->_array = __s;
  }
  else {
    this->_size = s;
  }
  return s <= uVar1;
}

Assistant:

inline bool ensure(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return true;
    }

    size_t newCapacity = std::max(s, _capacity*2);

    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");
    C* newArray=array_new<C>(mem, newCapacity);

    if(_array) {
      array_delete(_array, _capacity);
      DEALLOC_KNOWN(_array,sizeof(C)*_capacity,"DArray<>");
    }
    _size = s;
    _capacity = newCapacity;
    _array = newArray;
    return false;
  }